

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O1

ostream * anon_unknown.dwarf_184020::operator<<(ostream *out,IDManifest *mfst)

{
  int iVar1;
  long lVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  undefined8 *puVar6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  char local_45 [5];
  IDManifest *local_40;
  ulong local_38;
  
  lVar2 = Imf_3_2::IDManifest::size();
  if (lVar2 != 0) {
    uVar12 = 0;
    local_40 = mfst;
    do {
      local_38 = uVar12;
      lVar2 = Imf_3_2::IDManifest::operator[]((ulong)mfst);
      std::__ostream_insert<char,std::char_traits<char>>(out,"chans:",6);
      lVar3 = Imf_3_2::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
      p_Var4 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
      lVar3 = Imf_3_2::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
      if (p_Var4 != (_Rb_tree_node_base *)(lVar3 + 8)) {
        bVar10 = true;
        do {
          if (bVar10) {
            bVar10 = false;
          }
          else {
            local_45[0] = ',';
            std::__ostream_insert<char,std::char_traits<char>>(out,local_45,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (out,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
          lVar3 = Imf_3_2::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
        } while (p_Var4 != (_Rb_tree_node_base *)(lVar3 + 8));
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\nhash:",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,*(char **)(lVar2 + 0x50),*(long *)(lVar2 + 0x58));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(out,"encoding:",9);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,*(char **)(lVar2 + 0x70),*(long *)(lVar2 + 0x78));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar1 = *(int *)(lVar2 + 0x48);
      if (iVar1 == 0) {
        lVar2 = 0xf;
        pcVar9 = "lifetime:frame\n";
LAB_001703b0:
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar9,lVar2);
      }
      else {
        if (iVar1 == 1) {
          lVar2 = 0xe;
          pcVar9 = "lifetime:shot\n";
          goto LAB_001703b0;
        }
        if (iVar1 == 2) {
          lVar2 = 0x10;
          pcVar9 = "lifetime:stable\n";
          goto LAB_001703b0;
        }
      }
      local_45[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(out,local_45 + 1,1);
      puVar6 = (undefined8 *)Imf_3_2::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      puVar6 = (undefined8 *)*puVar6;
      while( true ) {
        lVar2 = Imf_3_2::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
        if (puVar6 == *(undefined8 **)(lVar2 + 8)) break;
        local_45[2] = 0x3b;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,local_45 + 2,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)*puVar6,puVar6[1]);
        puVar6 = puVar6 + 4;
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
      std::ostream::put((char)out);
      std::ostream::flush();
      p_Var4 = (_Rb_tree_node_base *)Imf_3_2::IDManifest::ChannelGroupManifest::begin();
      while( true ) {
        p_Var7 = (_Rb_tree_node_base *)Imf_3_2::IDManifest::ChannelGroupManifest::end();
        mfst = local_40;
        if (p_Var4 == p_Var7) break;
        std::ostream::_M_insert<unsigned_long>((ulong)out);
        for (p_Var11 = p_Var4[1]._M_parent; p_Var11 != p_Var4[1]._M_left; p_Var11 = p_Var11 + 1) {
          local_45[4] = 0x3b;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,local_45 + 4,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,*(char **)p_Var11,(long)p_Var11->_M_parent);
        }
        local_45[3] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(out,local_45 + 3,1);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      }
      uVar12 = local_38 + 1;
      uVar8 = Imf_3_2::IDManifest::size();
    } while (uVar12 < uVar8);
  }
  return out;
}

Assistant:

std::ostream&
operator<< (std::ostream& out, const IDManifest& mfst)
{
    for (size_t i = 0; i < mfst.size (); ++i)
    {

        const IDManifest::ChannelGroupManifest& m     = mfst[i];
        bool                                    first = true;
        out << "chans:";
        for (set<string>::const_iterator s = m.getChannels ().begin ();
             s != m.getChannels ().end ();
             ++s)
        {
            if (!first) { out << ','; }
            else
            {
                first = false;
            }

            out << *s;
        }

        out << "\nhash:" << m.getHashScheme () << endl;
        out << "encoding:" << m.getEncodingScheme () << endl;
        switch (m.getLifetime ())
        {
            case IDManifest::LIFETIME_FRAME: out << "lifetime:frame\n"; break;
            case IDManifest::LIFETIME_SHOT: out << "lifetime:shot\n"; break;
            case IDManifest::LIFETIME_STABLE: out << "lifetime:stable\n"; break;
        }
        out << ' ';
        for (vector<string>::const_iterator c = m.getComponents ().begin ();
             c != m.getComponents ().end ();
             ++c)
        {
            out << ';' << *c;
        }
        out << endl;
        for (IDManifest::ChannelGroupManifest::ConstIterator q = m.begin ();
             q != m.end ();
             ++q)
        {
            out << q.id ();
            for (vector<string>::const_iterator c = q.text ().begin ();
                 c != q.text ().end ();
                 ++c)
            {
                out << ';' << *c;
            }
            out << '\n';
        }
    }
    return out;
}